

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cpp
# Opt level: O2

void __thiscall unit_test::handle4(unit_test *this)

{
  ostream *poVar1;
  
  cppcms::http::context::response();
  poVar1 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar1,"message2");
  cppcms::http::context::async_complete_response();
  std::__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>
            );
  return;
}

Assistant:

void handle4()
	{
		context_->response().out()<<"message2";
		context_->async_complete_response();
		context_.reset();
	}